

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_f383c3::TestBuilder::DoPush
          (TestBuilder *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  DoPush(this);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&this->push,data);
  this->havePush = true;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DoPush(const std::vector<unsigned char>& data)
    {
        DoPush();
        push = data;
        havePush = true;
    }